

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O2

bool dxil_spv::analyze_load_instruction(Impl *impl,LoadInst *inst)

{
  undefined4 uVar1;
  undefined8 uVar2;
  GlobalVariable *pGVar3;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  Value *pVVar7;
  Type *this;
  ConstantExpr *this_00;
  iterator iVar8;
  Constant *pCVar9;
  mapped_type *pmVar10;
  LoggingCallback p_Var11;
  void *pvVar12;
  char *__ptr;
  size_t sStack_1070;
  undefined1 local_1065;
  undefined3 uStack_1064;
  AllocaTrackedIndex tracked;
  char buffer [4096];
  
  pVVar7 = LLVMBC::LoadInst::getPointerOperand(inst);
  gep_pointer_to_alloca_tracked_inst(&tracked,impl,pVVar7);
  if (tracked.cbv_handle != (Value *)0x0) {
    *(undefined1 *)
     ((long)tracked.itr.
            super__Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
            ._M_cur + 0x28) = 1;
    pVVar7 = LLVMBC::LoadInst::getPointerOperand(inst);
    buffer._0_8_ = LLVMBC::cast<LLVMBC::GetElementPtrInst>(pVVar7);
    std::
    _Hashtable<const_LLVMBC::GetElementPtrInst_*,_const_LLVMBC::GetElementPtrInst_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::GetElementPtrInst_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::GetElementPtrInst_*>,_std::hash<const_LLVMBC::GetElementPtrInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&(impl->masked_alloca_forward_gep)._M_h);
  }
  pVVar7 = LLVMBC::LoadInst::getPointerOperand(inst);
  this = LLVMBC::Value::getType(pVVar7);
  uVar6 = LLVMBC::Type::getPointerAddressSpace(this);
  if ((char)uVar6 == '\x03') {
    (impl->shader_analysis).has_group_shared_access = true;
  }
  pVVar7 = LLVMBC::LoadInst::getPointerOperand(inst);
  this_00 = LLVMBC::dyn_cast<LLVMBC::ConstantExpr>(pVVar7);
  if ((this_00 != (ConstantExpr *)0x0) &&
     (uVar6 = LLVMBC::ConstantExpr::getOpcode(this_00), uVar6 == 200)) {
    buffer._0_8_ = LLVMBC::ConstantExpr::getOperand(this_00,0);
    iVar8 = std::
            _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(impl->llvm_global_variable_to_resource_mapping)._M_h,(key_type *)buffer);
    if (iVar8.
        super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
        ._M_cur != (__node_type *)0x0) {
      pCVar9 = LLVMBC::ConstantExpr::getOperand(this_00,1);
      bVar5 = LLVMBC::isa<LLVMBC::ConstantInt>(&pCVar9->super_Value);
      if (bVar5) {
        uVar6 = LLVMBC::ConstantExpr::getNumOperands(this_00);
        if (uVar6 == 3) {
          uVar2 = *(undefined8 *)
                   ((long)iVar8.
                          super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                          ._M_cur + 0x10);
          pGVar3 = *(GlobalVariable **)
                    ((long)iVar8.
                           super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                           ._M_cur + 0x20);
          uStack_1064 = (undefined3)
                        ((uint)*(undefined4 *)
                                ((long)iVar8.
                                       super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                                       ._M_cur + 0x2c) >> 8);
          uVar1 = *(undefined4 *)
                   ((long)iVar8.
                          super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                          ._M_cur + 0x29);
          pCVar9 = LLVMBC::ConstantExpr::getOperand(this_00,2);
          buffer._0_8_ = this_00;
          pmVar10 = std::__detail::
                    _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&impl->llvm_global_variable_to_resource_mapping,
                                 (key_type *)buffer);
          pmVar10->type = (char)uVar2;
          *(int3 *)&pmVar10->field_0x1 = (int3)((ulong)uVar2 >> 8);
          pmVar10->meta_index = (int)((ulong)uVar2 >> 0x20);
          pmVar10->offset = &pCVar9->super_Value;
          pmVar10->variable = pGVar3;
          pmVar10->non_uniform = false;
          local_1065 = (undefined1)((uint)uVar1 >> 0x18);
          *(undefined4 *)&pmVar10->field_0x19 = uVar1;
          *(uint *)&pmVar10->field_0x1c = CONCAT31(uStack_1064,local_1065);
          goto LAB_0014b355;
        }
        p_Var11 = get_thread_log_callback();
        if (p_Var11 == (LoggingCallback)0x0) {
          __ptr = 
          "[ERROR]: Number of operands to getelementptr for a resource handle is unexpected.\n";
          sStack_1070 = 0x52;
          goto LAB_0014b44f;
        }
        memcpy(buffer,"Number of operands to getelementptr for a resource handle is unexpected.\n",
               0x4a);
      }
      else {
        p_Var11 = get_thread_log_callback();
        if (p_Var11 == (LoggingCallback)0x0) {
          __ptr = "[ERROR]: First GetElementPtr operand is not constant 0.\n";
          sStack_1070 = 0x38;
LAB_0014b44f:
          fwrite(__ptr,sStack_1070,1,_stderr);
          fflush(_stderr);
          return false;
        }
        builtin_strncpy(buffer + 0x20,"ot constant 0.\n",0x10);
        builtin_strncpy(buffer + 0x10,"Ptr operand is n",0x10);
        builtin_strncpy(buffer,"First GetElement",0x10);
      }
      pvVar12 = get_thread_log_callback_userdata();
      (*p_Var11)(pvVar12,Error,buffer);
      return false;
    }
  }
LAB_0014b355:
  buffer._0_8_ = LLVMBC::LoadInst::getPointerOperand(inst);
  iVar8 = std::
          _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(impl->llvm_global_variable_to_resource_mapping)._M_h,(key_type *)buffer);
  if (iVar8.
      super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
      ._M_cur != (__node_type *)0x0) {
    buffer._0_8_ = inst;
    pmVar10 = std::__detail::
              _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&impl->llvm_global_variable_to_resource_mapping,(key_type *)buffer);
    uVar2 = *(undefined8 *)
             ((long)iVar8.
                    super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                    ._M_cur + 0x10);
    pVVar7 = *(Value **)
              ((long)iVar8.
                     super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                     ._M_cur + 0x18);
    pGVar3 = *(GlobalVariable **)
              ((long)iVar8.
                     super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                     ._M_cur + 0x20);
    uVar4 = *(undefined8 *)
             ((long)iVar8.
                    super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                    ._M_cur + 0x28);
    pmVar10->type = (char)uVar2;
    *(int3 *)&pmVar10->field_0x1 = (int3)((ulong)uVar2 >> 8);
    pmVar10->meta_index = (int)((ulong)uVar2 >> 0x20);
    pmVar10->offset = pVVar7;
    pmVar10->variable = pGVar3;
    *(undefined8 *)&pmVar10->non_uniform = uVar4;
  }
  return true;
}

Assistant:

bool analyze_load_instruction(Converter::Impl &impl, const llvm::LoadInst *inst)
{
	auto tracked = gep_pointer_to_alloca_tracked_inst(impl, inst->getPointerOperand());
	if (tracked.cbv_handle)
	{
		tracked.itr->second.has_load = true;
		// We'll need this GEP after all.
		impl.masked_alloca_forward_gep.erase(llvm::cast<llvm::GetElementPtrInst>(inst->getPointerOperand()));
	}

	if (DXIL::AddressSpace(inst->getPointerOperand()->getType()->getPointerAddressSpace()) == DXIL::AddressSpace::GroupShared)
		impl.shader_analysis.has_group_shared_access = true;

	if (auto *const_expr = llvm::dyn_cast<llvm::ConstantExpr>(inst->getPointerOperand()))
	{
		if (const_expr->getOpcode() == llvm::Instruction::GetElementPtr)
		{
			auto *ptr = const_expr->getOperand(0);
			auto itr = impl.llvm_global_variable_to_resource_mapping.find(ptr);
			if (itr != impl.llvm_global_variable_to_resource_mapping.end() &&
			    !emit_getelementptr_resource(impl, const_expr, itr->second))
			{
				return false;
			}
		}
	}

	auto itr = impl.llvm_global_variable_to_resource_mapping.find(inst->getPointerOperand());
	if (itr != impl.llvm_global_variable_to_resource_mapping.end())
		impl.llvm_global_variable_to_resource_mapping[inst] = itr->second;

	return true;
}